

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O0

void __thiscall TCPServer::TCPServer(TCPServer *this,string *nm,SessionFactory *factory,int port)

{
  uint16_t uVar1;
  uint32_t uVar2;
  int iVar3;
  socklen_t local_74 [2];
  socklen_t len;
  int yes;
  int sock;
  sockaddr_in server_address;
  string local_48;
  int local_24;
  SessionFactory *pSStack_20;
  int port_local;
  SessionFactory *factory_local;
  string *nm_local;
  TCPServer *this_local;
  
  local_24 = port;
  pSStack_20 = factory;
  factory_local = (SessionFactory *)nm;
  nm_local = (string *)this;
  std::__cxx11::string::string((string *)&local_48,(string *)nm);
  Subscriber::Subscriber(&this->super_Subscriber,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_001a9bf8;
  std::function<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in)>::function
            (&this->client_factory,factory);
  server_address.sin_family = 0;
  server_address.sin_port = 0;
  server_address.sin_addr.s_addr = 0;
  yes._0_2_ = 2;
  yes._2_1_ = '\0';
  yes._3_1_ = '\0';
  sock._0_1_ = '\0';
  sock._1_1_ = '\0';
  sock._2_1_ = '\0';
  sock._3_1_ = '\0';
  uVar2 = htonl(0);
  sock = uVar2;
  uVar1 = htons((uint16_t)local_24);
  yes = CONCAT22(uVar1,(sa_family_t)yes);
  iVar3 = socket(2,1,0);
  len = no_err(iVar3,"create socket");
  local_74[1] = 1;
  iVar3 = setsockopt(len,1,2,local_74 + 1,4);
  no_err(iVar3,"setsockopt reuseaddr");
  iVar3 = bind(len,(sockaddr *)&yes,0x10);
  no_err(iVar3,"bind");
  iVar3 = listen(len,5);
  no_err(iVar3,"listen");
  Subscriber::set_fd(&this->super_Subscriber,len);
  Subscriber::set_expected(&this->super_Subscriber,1);
  local_74[0] = 0x10;
  iVar3 = getsockname(len,(sockaddr *)&yes,local_74);
  no_err(iVar3,"getsockname");
  uVar1 = ntohs(yes._2_2_);
  this->port = (uint)uVar1;
  return;
}

Assistant:

TCPServer::TCPServer(std::string nm, TCPServer::SessionFactory factory, int port) :
    Subscriber(std::move(nm)),
    client_factory(std::move(factory)) {
  struct sockaddr_in server_address{};
  server_address.sin_family = AF_INET; // IPv4
  server_address.sin_addr.s_addr = htonl(INADDR_ANY); // listening on all interfaces
  server_address.sin_port = htons(port);
  int sock = no_err(socket(PF_INET, SOCK_STREAM, 0), "create socket"); // creating IPv4 TCP file_desc

  int yes = 1;
  no_err(setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof(int)), "setsockopt reuseaddr");
  no_err(bind(sock, (struct sockaddr *) &server_address, sizeof(server_address)), "bind");
  // switch to listening (passive open)
  no_err(listen(sock, 5), "listen");
  set_fd(sock);
  set_expected(POLLIN);
  socklen_t len = sizeof(server_address);
  no_err(getsockname(sock, (struct sockaddr *) &server_address, &len), "getsockname");
  this->port = ntohs(server_address.sin_port);
}